

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::Level::~Level(Level *this)

{
  bool bVar1;
  iterator this_00;
  reference ppFVar2;
  __normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
  *in_RDI;
  iterator i;
  FaceData *in_stack_ffffffffffffffd8;
  
  this_00 = std::
            vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ::begin((vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                     *)in_stack_ffffffffffffffd8);
  while( true ) {
    std::
    vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
    ::end((vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
           *)in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
                               *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
              ::operator*((__normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
                           *)&stack0xfffffffffffffff0);
    if (*ppFVar2 != (FaceData *)0x0) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
                ::operator*((__normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
                             *)&stack0xfffffffffffffff0);
      in_stack_ffffffffffffffd8 = *ppFVar2;
      if (in_stack_ffffffffffffffd8 != (FaceData *)0x0) {
        (*(in_stack_ffffffffffffffd8->super_PtexFaceData)._vptr_PtexFaceData[1])();
      }
    }
    __gnu_cxx::
    __normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
    ::operator++((__normal_iterator<Ptex::v2_2::PtexReader::FaceData_**,_std::vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  std::
  vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>::
  ~vector((vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
           *)this_00._M_current);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)this_00._M_current);
  std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::~vector
            ((vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_> *)
             this_00._M_current);
  return;
}

Assistant:

~Level() {
            for (std::vector<FaceData*>::iterator i = faces.begin(); i != faces.end(); ++i) {
                if (*i) delete *i;
            }
        }